

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_reader.cpp
# Opt level: O2

void __thiscall
duckdb::MetadataReader::ReadData(MetadataReader *this,data_ptr_t buffer,idx_t read_size)

{
  data_ptr_t pdVar1;
  size_t __n;
  
  while( true ) {
    if (this->offset + read_size <= this->capacity) break;
    __n = this->capacity - this->offset;
    if (__n != 0) {
      pdVar1 = Ptr(this);
      switchD_016b45db::default(buffer,pdVar1,__n);
      read_size = read_size - __n;
      buffer = buffer + __n;
      this->offset = this->offset + read_size;
    }
    ReadNextBlock(this);
  }
  pdVar1 = Ptr(this);
  switchD_016b45db::default(buffer,pdVar1,read_size);
  this->offset = this->offset + read_size;
  return;
}

Assistant:

void MetadataReader::ReadData(data_ptr_t buffer, idx_t read_size) {
	while (offset + read_size > capacity) {
		// cannot read entire entry from block
		// first read what we can from this block
		idx_t to_read = capacity - offset;
		if (to_read > 0) {
			memcpy(buffer, Ptr(), to_read);
			read_size -= to_read;
			buffer += to_read;
			offset += read_size;
		}
		// then move to the next block
		ReadNextBlock();
	}
	// we have enough left in this block to read from the buffer
	memcpy(buffer, Ptr(), read_size);
	offset += read_size;
}